

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O0

void test_value_ctor(void)

{
  bool bVar1;
  reference_type piVar2;
  reference_type piVar3;
  value_type local_40;
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_0>,_ak_toolbox::compact_optional_ns::default_tag>
  local_3c;
  value_type local_38;
  opt_int_conflict oi1_1;
  value_type local_30;
  opt_int_conflict oi0_1;
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_0>,_ak_toolbox::compact_optional_ns::default_tag>
  local_28;
  opt_int_conflict oiN1_1;
  opt_int_conflict oi__1;
  value_type local_1c;
  opt_int oi1;
  value_type local_14;
  opt_int oi0;
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,__1>,_ak_toolbox::compact_optional_ns::default_tag>
  local_c;
  opt_int oiN1;
  opt_int oi_;
  
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_c);
  local_14 = -1;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&oi0,&local_14);
  local_1c = 0;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&oi1,&local_1c);
  oiN1_1.super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>.super_type.
  value_ = (compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>)(type)0x1;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional((compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,__1>,_ak_toolbox::compact_optional_ns::default_tag>
                      *)&oi__1,(value_type *)&oiN1_1);
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::has_value
                    (&local_c.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_>
                    );
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!oi_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x1e,"void test_value_ctor()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::has_value
                    (&oi0.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_>
                    );
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!oiN1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x1f,"void test_value_ctor()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::has_value
                    (&oi1.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_>
                    );
  if (!bVar1) {
    __assert_fail("oi0.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x20,"void test_value_ctor()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::has_value
                    ((compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_> *)
                     &oi__1);
  if (!bVar1) {
    __assert_fail("oi1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x21,"void test_value_ctor()");
  }
  piVar2 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::value
                     (&oi1.
                       super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_>
                     );
  if (*piVar2 != 0) {
    __assert_fail("oi0.value() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x23,"void test_value_ctor()");
  }
  piVar2 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::value
                     ((compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_> *)
                      &oi__1);
  if (*piVar2 != 1) {
    __assert_fail("oi1.value() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x24,"void test_value_ctor()");
  }
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_0>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_28);
  local_30 = -1;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_0>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&oi0_1,&local_30);
  local_38 = 0;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_0>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&oi1_1,&local_38);
  local_40 = 1;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_0>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_3c,&local_40);
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>::has_value
                    (&local_28.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>
                    );
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!oi_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x2a,"void test_value_ctor()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>::has_value
                    (&oi0_1.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>
                    );
  if (!bVar1) {
    __assert_fail("oiN1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x2b,"void test_value_ctor()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>::has_value
                    (&oi1_1.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>
                    );
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!oi0.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x2c,"void test_value_ctor()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>::has_value
                    (&local_3c.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>
                    );
  if (!bVar1) {
    __assert_fail("oi1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x2d,"void test_value_ctor()");
  }
  piVar3 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>::value
                     (&oi0_1.
                       super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>
                     );
  if (*piVar3 != -1) {
    __assert_fail("oiN1.value() == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x2f,"void test_value_ctor()");
  }
  piVar3 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>::value
                     (&local_3c.
                       super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_0>_>
                     );
  if (*piVar3 == 1) {
    return;
  }
  __assert_fail("oi1.value() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,0x30,"void test_value_ctor()");
}

Assistant:

void test_value_ctor()
{
  {
    typedef compact_optional< evp_int<int, -1> > opt_int;
    static_assert (sizeof(opt_int) == sizeof(int), "size waste");
    
    opt_int oi_, oiN1(-1), oi0(0), oi1(1);
    assert (!oi_.has_value());
    assert (!oiN1.has_value());
    assert ( oi0.has_value());
    assert ( oi1.has_value());
    
    assert (oi0.value() == 0);
    assert (oi1.value() == 1);
  }
  {
    typedef compact_optional< evp_int<int, 0> > opt_int;
    static_assert (sizeof(opt_int) == sizeof(int), "size waste");
    opt_int oi_, oiN1(-1), oi0(0), oi1(1);
    assert (!oi_.has_value());
    assert ( oiN1.has_value());
    assert (!oi0.has_value());
    assert ( oi1.has_value());
    
    assert (oiN1.value() == -1);
    assert (oi1.value() == 1);
  }
}